

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  u8 uVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pEnd;
  byte *pbVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  char *p2;
  char *p1;
  sqlite3_int64 iVal;
  char *p_1;
  byte *local_90;
  byte *local_88;
  long local_80;
  byte *local_78;
  byte *local_70;
  byte *local_68;
  int local_60;
  int local_5c;
  Fts3Phrase *local_58;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  long local_38;
  
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (p->doclist).aAll = (char *)0x0;
    (p->doclist).nAll = 0;
  }
  else {
    iVar5 = p->iDoclistToken;
    if (iVar5 < 0) {
      (p->doclist).aAll = pList;
      (p->doclist).nAll = nList;
    }
    else {
      pbVar2 = (byte *)(p->doclist).aAll;
      if (pbVar2 != (byte *)0x0) {
        iVar11 = (p->doclist).nAll;
        local_5c = iVar5 - iToken;
        pbVar6 = pbVar2;
        iVar15 = nList;
        if (iVar5 < iToken) {
          local_5c = iToken - iVar5;
          pbVar6 = (byte *)pList;
          pList = (char *)pbVar2;
          iVar15 = iVar11;
          iVar11 = nList;
        }
        uVar1 = pTab->bDescIdx;
        local_70 = (byte *)(long)iVar11;
        local_90 = pbVar6;
        local_88 = (byte *)pList;
        local_78 = pbVar6;
        local_50 = (byte *)pList;
        if (uVar1 == '\0') {
LAB_001d2aeb:
          local_68 = pbVar6;
          local_60 = iToken;
          local_58 = p;
          local_40 = pbVar6;
          if (iVar15 < 1) {
            local_88 = (byte *)0x0;
            lVar12 = 0;
          }
          else {
            iVar5 = sqlite3Fts3GetVarint(pList,&local_80);
            local_88 = (byte *)pList + iVar5;
            lVar12 = local_80;
          }
          pbVar2 = local_78;
          if (iVar11 < 1) {
            local_90 = (byte *)0x0;
            lVar14 = 0;
          }
          else {
            iVar5 = sqlite3Fts3GetVarint((char *)local_78,&local_80);
            local_90 = pbVar2 + iVar5;
            lVar14 = local_80;
          }
          if (local_90 != (byte *)0x0 && local_88 != (byte *)0x0) {
            local_48 = local_50 + iVar15;
            local_70 = local_70 + (long)local_78;
            bVar4 = false;
            lVar13 = 0;
            do {
              pbVar2 = local_68;
              lVar10 = -(lVar12 - lVar14);
              if (uVar1 == '\0') {
                lVar10 = lVar12 - lVar14;
              }
              if (lVar10 == 0) {
                uVar7 = lVar13 - lVar12;
                if (!bVar4) {
                  uVar7 = lVar12 - lVar13;
                }
                if (uVar1 == '\0') {
                  uVar7 = lVar12 - lVar13;
                }
                do {
                  pbVar6 = local_68;
                  bVar8 = (byte)uVar7;
                  *pbVar6 = bVar8 | 0x80;
                  local_68 = pbVar6 + 1;
                  bVar3 = 0x7f < uVar7;
                  uVar7 = uVar7 >> 7;
                } while (bVar3);
                *pbVar6 = bVar8;
                local_38 = lVar13;
                iVar5 = fts3PoslistPhraseMerge
                                  ((char **)&local_68,local_5c,0,1,(char **)&local_88,
                                   (char **)&local_90);
                pbVar6 = local_88;
                lVar13 = lVar12;
                bVar3 = true;
                if (iVar5 == 0) {
                  lVar13 = local_38;
                  local_68 = pbVar2;
                  bVar3 = bVar4;
                }
                if (local_88 < local_48) {
                  iVar5 = sqlite3Fts3GetVarint((char *)local_88,&local_80);
                  local_88 = pbVar6 + iVar5;
                  lVar10 = -local_80;
                  if (uVar1 == '\0') {
                    lVar10 = local_80;
                  }
                  lVar12 = lVar12 + lVar10;
                }
                else {
                  local_88 = (byte *)0x0;
                }
                pbVar2 = local_90;
                bVar4 = bVar3;
                if (local_90 < local_70) {
                  iVar5 = sqlite3Fts3GetVarint((char *)local_90,&local_80);
                  local_90 = pbVar2 + iVar5;
                  lVar10 = -local_80;
                  if (uVar1 == '\0') {
                    lVar10 = local_80;
                  }
                  lVar14 = lVar14 + lVar10;
                }
                else {
                  local_90 = (byte *)0x0;
                }
              }
              else if (lVar10 < 0) {
                bVar8 = *local_88;
                if (*local_88 != 0) {
                  do {
                    pbVar2 = local_88 + 1;
                    local_88 = local_88 + 1;
                    bVar9 = bVar8 & 0x80;
                    bVar8 = *pbVar2;
                  } while (bVar9 != 0 || *pbVar2 != 0);
                }
                local_88 = local_88 + 1;
                if (local_88 < local_48) {
                  iVar5 = sqlite3Fts3GetVarint((char *)local_88,&local_80);
                  local_88 = local_88 + iVar5;
                  lVar10 = -local_80;
                  if (uVar1 == '\0') {
                    lVar10 = local_80;
                  }
                  lVar12 = lVar12 + lVar10;
                }
                else {
                  local_88 = (byte *)0x0;
                }
              }
              else {
                bVar8 = *local_90;
                if (*local_90 != 0) {
                  do {
                    pbVar2 = local_90 + 1;
                    local_90 = local_90 + 1;
                    bVar9 = bVar8 & 0x80;
                    bVar8 = *pbVar2;
                  } while (bVar9 != 0 || *pbVar2 != 0);
                }
                local_90 = local_90 + 1;
                if (local_90 < local_70) {
                  iVar5 = sqlite3Fts3GetVarint((char *)local_90,&local_80);
                  local_90 = local_90 + iVar5;
                  lVar10 = -local_80;
                  if (uVar1 == '\0') {
                    lVar10 = local_80;
                  }
                  lVar14 = lVar14 + lVar10;
                }
                else {
                  local_90 = (byte *)0x0;
                }
              }
            } while ((local_88 != (byte *)0x0) && (local_90 != (byte *)0x0));
          }
          pbVar2 = local_40;
          iVar11 = (int)local_68 - (int)local_40;
          iVar5 = 0;
          p = local_58;
          pbVar6 = local_78;
          iToken = local_60;
          if (uVar1 != '\0') {
            sqlite3_free(local_78);
            p = local_58;
            pbVar6 = pbVar2;
            iToken = local_60;
          }
        }
        else {
          iVar5 = sqlite3_initialize();
          if (iVar5 == 0) {
            pbVar6 = (byte *)sqlite3Malloc((u64)(local_70 + 10));
          }
          else {
            pbVar6 = (byte *)0x0;
          }
          if (pbVar6 != (byte *)0x0) goto LAB_001d2aeb;
          iVar5 = 7;
          p = p;
          pbVar6 = local_78;
        }
        sqlite3_free(local_50);
        (p->doclist).aAll = (char *)pbVar6;
        (p->doclist).nAll = iVar11;
        goto LAB_001d2e23;
      }
      sqlite3_free(pList);
    }
  }
  iVar5 = 0;
LAB_001d2e23:
  if (p->iDoclistToken < iToken) {
    p->iDoclistToken = iToken;
  }
  return iVar5;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}